

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorByType.cpp
# Opt level: O2

void ApprovalTests::EmptyFileCreatorByType::createFile(string *fileName)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fullFilePath;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  p_Var2 = (_Rb_tree_node_base *)creators__abi_cxx11_._24_8_;
  do {
    if (p_Var2 == (_Rb_tree_node_base *)(creators__abi_cxx11_ + 8)) {
      fullFilePath = &local_b0;
      ::std::__cxx11::string::string((string *)fullFilePath,(string *)fileName);
      EmptyFileCreatorFactory::defaultCreator(fullFilePath);
LAB_0012b94f:
      ::std::__cxx11::string::~string((string *)fullFilePath);
      return;
    }
    ::std::__cxx11::string::string((string *)&local_50,(string *)fileName);
    ::std::__cxx11::string::string((string *)&local_70,(string *)(p_Var2 + 1));
    bVar1 = StringUtils::endsWith(&local_50,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      fullFilePath = &local_90;
      ::std::__cxx11::string::string((string *)fullFilePath,(string *)fileName);
      ::std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)(p_Var2 + 2),fullFilePath);
      goto LAB_0012b94f;
    }
    p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void EmptyFileCreatorByType::createFile(const std::string& fileName)
    {
        for (const auto& creator : creators_)
        {
            if (StringUtils::endsWith(fileName, creator.first))
            {
                creator.second(fileName);
                return;
            }
        }
        EmptyFileCreatorFactory::defaultCreator(fileName);
    }